

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

int __thiscall HModel::load_fromMPS(HModel *this,char *filename)

{
  int *numCol;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  double dVar6;
  
  clearModel(this);
  this->totalTime = 0.0;
  HTimer::reset(&this->timer);
  std::__cxx11::string::assign((char *)&this->modelName);
  numCol = &this->numCol;
  iVar1 = readMPS(filename,-1,-1,&this->numRow,numCol,&this->objSense,&this->objOffset,&this->Astart
                  ,&this->Aindex,&this->Avalue,&this->colCost,&this->colLower,&this->colUpper,
                  &this->rowLower,&this->rowUpper,&this->integerColumn);
  if (iVar1 == 0) {
    uVar2 = *numCol;
    uVar3 = 0;
    uVar5 = 0;
    if (0 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
    }
    iVar4 = 0;
    for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      iVar4 = (iVar4 + 1) -
              (uint)((this->integerColumn).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar3] == 0);
    }
    if (iVar4 != 0) {
      printf("MPS file has %d integer variables\n");
      uVar2 = *numCol;
    }
    this->numTot = uVar2 + this->numRow;
    initScale(this);
    initWithLogicalBasis(this);
  }
  dVar6 = HTimer::getTime(&this->timer);
  this->totalTime = dVar6 + this->totalTime;
  return iVar1;
}

Assistant:

int HModel::load_fromMPS(const char *filename) {
  // Remove any current model
  clearModel();
  
  // Initialise the total runtine for this model
  totalTime = 0;

  // Load the model, timing the process
  timer.reset();
  modelName = filename;

  //setup_loadMPS(filename);

  int mxNumRow = -1;
  int mxNumCol = -1;
  int RtCd = readMPS(filename, mxNumRow, mxNumCol,
		     numRow, numCol, objSense, objOffset,
		     Astart,  Aindex, Avalue,
		     colCost, colLower, colUpper, rowLower, rowUpper,
		     integerColumn);
  if (RtCd) {
    totalTime += timer.getTime();
    return RtCd;
  }

#ifdef JAJH_dev
  int numIntegerColumn = 0;
  for (int c_n=0; c_n<numCol; c_n++) {
    if (integerColumn[c_n]) numIntegerColumn++;
  }
  if (numIntegerColumn) printf("MPS file has %d integer variables\n", numIntegerColumn);
#endif
 
  numTot = numCol + numRow;

#ifdef JAJH_dev
  //Use this next line to check the loading of a model from arrays
  //check_load_fromArrays(); return;
#endif

  // Assign and initialise the scaling factors
  initScale();
  
  // Initialise with a logical basis then allocate and populate (where
  // possible) work* arrays and allocate basis* arrays
  initWithLogicalBasis();

  totalTime += timer.getTime();
  return RtCd;
}